

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeliefSparse.cpp
# Opt level: O2

double __thiscall
BeliefSparse::InnerProduct(BeliefSparse *this,vector<double,_std::allocator<double>_> *values)

{
  undefined1 auVar1 [16];
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  BScit it;
  double local_40;
  undefined1 local_38 [24];
  long *local_20;
  
  boost::numeric::ublas::
  compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  ::begin((compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
           *)local_38);
  local_40 = 0.0;
  while( true ) {
    boost::numeric::ublas::
    compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
    ::end((compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
           *)(local_38 + 0x10));
    if ((long *)local_38._8_8_ == local_20) break;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_40;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = *(ulong *)(local_38._8_8_ +
                             (*(long *)(local_38._0_8_ + 0x40) - *(long *)(local_38._0_8_ + 0x28)));
    lVar2 = *(long *)local_38._8_8_;
    local_38._8_8_ = local_38._8_8_ + 8;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (values->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start[lVar2];
    auVar1 = vfmadd231sd_fma(auVar4,auVar3,auVar1);
    local_40 = auVar1._0_8_;
  }
  return local_40;
}

Assistant:

double BeliefSparse::InnerProduct(const vector<double> &values) const
{
#if BeliefSparse_CheckAndAbort
    if(!SanityCheck())
        abort();
#endif
    double x=0;
    for(BScit it=_m_b.begin(); it!=_m_b.end(); ++it)
        x+=(*it)*values[it.index()];

    return(x);
}